

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  string *psVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  int line;
  size_t in_RDX;
  size_t width;
  internal *piVar4;
  int iVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string message;
  string location;
  string kIndent;
  int local_34;
  
  Indent_abi_cxx11_((string *)((long)&location.field_2 + 8),(internal *)0xa,in_RDX);
  iVar5 = 0;
  iVar6 = 0;
  while( true ) {
    line = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar5) break;
    pTVar2 = TestResult::GetTestPartResult(result,iVar5);
    if (pTVar2->type_ - kNonFatalFailure < 2) {
      std::operator<<(stream,",\n");
      if (iVar6 == 0) {
        poVar3 = std::operator<<(stream,(string *)(location.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3,"failures");
        std::operator<<(poVar3,"\": [\n");
      }
      piVar4 = (internal *)(pTVar2->file_name_)._M_string_length;
      if (piVar4 != (internal *)0x0) {
        piVar4 = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
      }
      psVar1 = (string *)((long)&message.field_2 + 8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (psVar1,piVar4,(char *)(ulong)(uint)pTVar2->line_number_,line);
      std::operator+(&local_c8,psVar1,"\n");
      std::operator+(&local_e8,&local_c8,(pTVar2->message_)._M_dataplus._M_p);
      EscapeJson((string *)local_a8,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      poVar3 = std::operator<<(stream,(string *)(location.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"  {\n");
      poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"    \"failure\": \"");
      poVar3 = std::operator<<(poVar3,(string *)local_a8);
      poVar3 = std::operator<<(poVar3,"\",\n");
      poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"    \"type\": \"\"\n");
      poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"  }");
      iVar6 = iVar6 + 1;
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
    iVar5 = iVar5 + 1;
  }
  if (0 < iVar6) {
    poVar3 = std::operator<<(stream,"\n");
    poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
    std::operator<<(poVar3,"]");
  }
  local_34 = 0;
  iVar5 = 0;
  while( true ) {
    iVar6 = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar5) break;
    pTVar2 = TestResult::GetTestPartResult(result,iVar5);
    if (pTVar2->type_ == kSkip) {
      std::operator<<(stream,",\n");
      if (local_34 == 0) {
        poVar3 = std::operator<<(stream,(string *)(location.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3,"skipped");
        std::operator<<(poVar3,"\": [\n");
      }
      piVar4 = (internal *)(pTVar2->file_name_)._M_string_length;
      if (piVar4 != (internal *)0x0) {
        piVar4 = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
      }
      psVar1 = (string *)((long)&message.field_2 + 8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (psVar1,piVar4,(char *)(ulong)(uint)pTVar2->line_number_,iVar6);
      std::operator+(&local_c8,psVar1,"\n");
      std::operator+(&local_e8,&local_c8,(pTVar2->message_)._M_dataplus._M_p);
      EscapeJson((string *)local_a8,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      poVar3 = std::operator<<(stream,(string *)(location.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"  {\n");
      poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"    \"message\": \"");
      poVar3 = std::operator<<(poVar3,(string *)local_a8);
      poVar3 = std::operator<<(poVar3,"\"\n");
      poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"  }");
      local_34 = local_34 + 1;
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
    iVar5 = iVar5 + 1;
  }
  if (0 < local_34) {
    poVar3 = std::operator<<(stream,"\n");
    poVar3 = std::operator<<(poVar3,(string *)(location.field_2._M_local_buf + 8));
    std::operator<<(poVar3,"]");
  }
  poVar3 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_((string *)((long)&message.field_2 + 8),(internal *)0x8,width);
  poVar3 = std::operator<<(poVar3,(string *)(message.field_2._M_local_buf + 8));
  std::operator<<(poVar3,"}");
  std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}